

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseContent(xmlParserCtxtPtr ctxt)

{
  if ((ctxt != (xmlParserCtxtPtr)0x0) && (ctxt->input != (xmlParserInputPtr)0x0)) {
    xmlCtxtInitializeLate(ctxt);
    xmlParseContentInternal(ctxt);
    if (ctxt->input->cur < ctxt->input->end) {
      xmlFatalErr(ctxt,XML_ERR_NOT_WELL_BALANCED,(char *)0x0);
      return;
    }
  }
  return;
}

Assistant:

void
xmlParseContent(xmlParserCtxtPtr ctxt) {
    if ((ctxt == NULL) || (ctxt->input == NULL))
        return;

    xmlCtxtInitializeLate(ctxt);

    xmlParseContentInternal(ctxt);

    if (ctxt->input->cur < ctxt->input->end)
	xmlFatalErr(ctxt, XML_ERR_NOT_WELL_BALANCED, NULL);
}